

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O2

void __thiscall SignatureCache::SignatureCache(SignatureCache *this,size_t max_size_bytes)

{
  CSHA256 *this_00;
  long lVar1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  pair<unsigned_int,_unsigned_long> pVar2;
  ulong local_70;
  ulong local_68;
  uint local_60 [2];
  ulong local_58;
  uint256 nonce;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_salted_hasher_ecdsa);
  this_00 = &this->m_salted_hasher_schnorr;
  CSHA256::CSHA256(this_00);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&this->setValid);
  *(undefined8 *)((long)&(this->cs_sigcache)._M_impl._M_rwlock + 0x20) = 0;
  (this->cs_sigcache)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->cs_sigcache)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->cs_sigcache)._M_impl._M_rwlock + 0x18) = 0;
  (this->cs_sigcache)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->cs_sigcache)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->cs_sigcache)._M_impl._M_rwlock + 0x30) = 0;
  GetRandHash();
  CSHA256::Write(&this->m_salted_hasher_ecdsa,(uchar *)&nonce,0x20);
  CSHA256::Write(&this->m_salted_hasher_ecdsa,"E",0x20);
  CSHA256::Write(this_00,(uchar *)&nonce,0x20);
  CSHA256::Write(this_00,"S",0x20);
  pVar2 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    (&this->setValid,max_size_bytes);
  local_58 = pVar2.second;
  local_60[0] = pVar2.first;
  local_68 = local_58 >> 0x14;
  local_70 = max_size_bytes >> 0x14;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sigcache.cpp"
  ;
  source_file._M_len = 99;
  logging_function._M_str = "SignatureCache";
  logging_function._M_len = 0xe;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,0x24,ALL,Info,(ConstevalFormatString<3U>)0xcce268,
             &local_68,&local_70,local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SignatureCache::SignatureCache(const size_t max_size_bytes)
{
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy, and then pad with 'E' for ECDSA and
    // 'S' for Schnorr (followed by 0 bytes).
    static constexpr unsigned char PADDING_ECDSA[32] = {'E'};
    static constexpr unsigned char PADDING_SCHNORR[32] = {'S'};
    m_salted_hasher_ecdsa.Write(nonce.begin(), 32);
    m_salted_hasher_ecdsa.Write(PADDING_ECDSA, 32);
    m_salted_hasher_schnorr.Write(nonce.begin(), 32);
    m_salted_hasher_schnorr.Write(PADDING_SCHNORR, 32);

    const auto [num_elems, approx_size_bytes] = setValid.setup_bytes(max_size_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for signature cache, able to store %zu elements\n",
              approx_size_bytes >> 20, max_size_bytes >> 20, num_elems);
}